

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void ts_parser__accept(TSParser *self,StackVersion version,Subtree lookahead)

{
  SubtreePool *pool;
  StackSlice *pSVar1;
  uint new_count;
  Subtree self_00;
  Subtree *elements;
  undefined8 uVar2;
  _Bool _Var3;
  ushort uVar4;
  MutableSubtree right;
  uint32_t k;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  StackSliceArray SVar8;
  SubtreeArray trees;
  
  if (((ulong)lookahead.ptr & 1) == 0) {
    uVar4 = (lookahead.ptr)->symbol;
  }
  else {
    uVar4 = (ushort)lookahead.data.symbol;
  }
  if (uVar4 != 0) {
    __assert_fail("ts_subtree_is_eof(lookahead)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/parser.c"
                  ,0x2fd,"void ts_parser__accept(TSParser *, StackVersion, Subtree)");
  }
  uVar6 = 0;
  ts_stack_push(self->stack,version,lookahead,false,1);
  SVar8 = ts_stack_pop_all(self->stack,version);
  pool = &self->tree_pool;
  do {
    if (uVar6 == (SVar8._8_8_ & 0xffffffff)) {
      ts_stack_remove_version(self->stack,(SVar8.contents)->version);
      ts_stack_halt(self->stack,version);
      return;
    }
    pSVar1 = SVar8.contents + uVar6;
    trees.contents = (pSVar1->subtrees).contents;
    uVar2._0_4_ = (pSVar1->subtrees).size;
    uVar2._4_4_ = (pSVar1->subtrees).capacity;
    right.ptr = (SubtreeHeapData *)0x0;
    trees._8_8_ = uVar2;
    do {
      bVar7 = (uint32_t)uVar2 == 0;
      uVar2._0_4_ = (uint32_t)uVar2 - 1;
      if (bVar7) break;
      self_00 = (Subtree)trees.contents[(uint32_t)uVar2].ptr;
      _Var3 = ts_subtree_extra(self_00);
      if (!_Var3) {
        if (((ulong)self_00.ptr & 1) != 0) {
          __assert_fail("!child.data.is_inline",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/parser.c"
                        ,0x308,"void ts_parser__accept(TSParser *, StackVersion, Subtree)");
        }
        new_count = (self_00.ptr)->child_count;
        for (uVar5 = 0; elements = ((self_00.ptr)->field_17).field_0.children, new_count != uVar5;
            uVar5 = uVar5 + 1) {
          ts_subtree_retain(elements[uVar5]);
        }
        array__splice((VoidArray *)&trees,8,(uint32_t)uVar2,1,new_count,elements);
        right = ts_subtree_new_node(pool,(self_00.ptr)->symbol,&trees,
                                    (uint)((self_00.ptr)->field_17).field_0.alias_sequence_id,
                                    self->language);
        ts_subtree_release(pool,self_00);
      }
    } while (_Var3);
    if (right.ptr == (SubtreeHeapData *)0x0) {
      __assert_fail("root.ptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/parser.c"
                    ,0x31a,"void ts_parser__accept(TSParser *, StackVersion, Subtree)");
    }
    self->accept_count = self->accept_count + 1;
    if ((self->finished_tree).ptr == (SubtreeHeapData *)0x0) {
LAB_0011c968:
      self->finished_tree = (Subtree)right;
    }
    else {
      _Var3 = ts_parser__select_tree(self,self->finished_tree,(Subtree)right);
      if (_Var3) {
        ts_subtree_release(pool,self->finished_tree);
        goto LAB_0011c968;
      }
      ts_subtree_release(pool,(Subtree)right);
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

static void ts_parser__accept(TSParser *self, StackVersion version, Subtree lookahead) {
  assert(ts_subtree_is_eof(lookahead));
  ts_stack_push(self->stack, version, lookahead, false, 1);

  StackSliceArray pop = ts_stack_pop_all(self->stack, version);
  for (uint32_t i = 0; i < pop.size; i++) {
    SubtreeArray trees = pop.contents[i].subtrees;

    Subtree root = NULL_SUBTREE;
    for (uint32_t j = trees.size - 1; j + 1 > 0; j--) {
      Subtree child = trees.contents[j];
      if (!ts_subtree_extra(child)) {
        assert(!child.data.is_inline);
        uint32_t child_count = ts_subtree_child_count(child);
        for (uint32_t k = 0; k < child_count; k++) {
          ts_subtree_retain(child.ptr->children[k]);
        }
        array_splice(&trees, j, 1, child_count, child.ptr->children);
        root = ts_subtree_from_mut(ts_subtree_new_node(
          &self->tree_pool,
          ts_subtree_symbol(child),
          &trees,
          child.ptr->alias_sequence_id,
          self->language
        ));
        ts_subtree_release(&self->tree_pool, child);
        break;
      }
    }

    assert(root.ptr);
    self->accept_count++;

    if (self->finished_tree.ptr) {
      if (ts_parser__select_tree(self, self->finished_tree, root)) {
        ts_subtree_release(&self->tree_pool, self->finished_tree);
        self->finished_tree = root;
      } else {
        ts_subtree_release(&self->tree_pool, root);
      }
    } else {
      self->finished_tree = root;
    }
  }

  ts_stack_remove_version(self->stack, pop.contents[0].version);
  ts_stack_halt(self->stack, version);
}